

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O2

void __thiscall
MinVR::VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRConsoleNode>::~VRConcreteItemFactory
          (VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRConsoleNode> *this)

{
  VRSpecificItemFactory<MinVR::VRDisplayNode>::~VRSpecificItemFactory
            (&this->super_VRSpecificItemFactory<MinVR::VRDisplayNode>);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~VRConcreteItemFactory() {}